

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O1

int Io_ReadBlifReorderFormalNames(Vec_Ptr_t *vTokens,Mio_Gate_t *pGate,Mio_Gate_t *pTwin)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Mio_Pin_t *pMVar7;
  char *pcVar8;
  size_t sVar9;
  void **ppvVar10;
  char *pcVar11;
  void *Entry;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  
  uVar1 = vTokens->nSize;
  uVar16 = (ulong)uVar1;
  iVar15 = uVar1 - 3;
  iVar4 = Mio_GateReadPinNum(pGate);
  if (pTwin == (Mio_Gate_t *)0x0) {
    if (iVar15 != iVar4) {
      return 0;
    }
  }
  else if ((iVar15 != iVar4) && (iVar4 = Mio_GateReadPinNum(pGate), uVar1 - 4 != iVar4)) {
    return 0;
  }
  pMVar7 = Mio_GateReadPins(pGate);
  if (pMVar7 == (Mio_Pin_t *)0x0) {
    iVar4 = 0;
  }
  else {
    lVar13 = 2;
    iVar4 = 0;
    do {
      pcVar8 = Mio_PinReadName(pMVar7);
      iVar6 = (int)lVar13;
      if (vTokens->nSize <= iVar6) goto LAB_0032b892;
      sVar9 = strlen(pcVar8);
      pcVar11 = (char *)vTokens->pArray[lVar13];
      iVar5 = strncmp(pcVar8,pcVar11,(long)(int)sVar9);
      if (iVar5 != 0) goto LAB_0032b404;
      if (pcVar11[(int)sVar9] != '=') {
        iVar4 = iVar6 + -2;
        goto LAB_0032b404;
      }
      pMVar7 = Mio_PinReadNext(pMVar7);
      iVar4 = iVar4 + 1;
      lVar13 = lVar13 + 1;
    } while (pMVar7 != (Mio_Pin_t *)0x0);
    iVar4 = iVar6 + -1;
  }
LAB_0032b404:
  iVar6 = Mio_GateReadPinNum(pGate);
  if (pTwin == (Mio_Gate_t *)0x0) {
    if (iVar4 == iVar6) {
      return 1;
    }
    for (pMVar7 = Mio_GateReadPins(pGate); pMVar7 != (Mio_Pin_t *)0x0;
        pMVar7 = Mio_PinReadNext(pMVar7)) {
      pcVar8 = Mio_PinReadName(pMVar7);
      if (2 < (int)uVar1) {
        sVar9 = strlen(pcVar8);
        uVar2 = vTokens->nSize;
        uVar12 = 2;
        if (2 < (int)uVar2) {
          uVar12 = (ulong)uVar2;
        }
        uVar14 = 2;
        do {
          if (uVar12 == uVar14) goto LAB_0032b892;
          ppvVar10 = vTokens->pArray;
          pcVar11 = (char *)ppvVar10[uVar14];
          iVar4 = strncmp(pcVar8,pcVar11,(long)(int)sVar9);
          if ((iVar4 == 0) && (pcVar11[(int)sVar9] == '=')) {
            uVar3 = vTokens->nCap;
            if (uVar2 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (ppvVar10 == (void **)0x0) {
                  ppvVar10 = (void **)malloc(0x80);
                }
                else {
                  ppvVar10 = (void **)realloc(ppvVar10,0x80);
                }
                iVar4 = 0x10;
              }
              else {
                iVar4 = uVar3 * 2;
                if (iVar4 <= (int)uVar3) goto LAB_0032b5a4;
                if (ppvVar10 == (void **)0x0) {
                  ppvVar10 = (void **)malloc((ulong)uVar3 << 4);
                }
                else {
                  ppvVar10 = (void **)realloc(ppvVar10,(ulong)uVar3 << 4);
                }
              }
              vTokens->pArray = ppvVar10;
              vTokens->nCap = iVar4;
            }
LAB_0032b5a4:
            iVar4 = vTokens->nSize;
            vTokens->nSize = iVar4 + 1;
            vTokens->pArray[iVar4] = pcVar11;
            break;
          }
          uVar14 = uVar14 + 1;
        } while (uVar16 != uVar14);
      }
    }
    pcVar8 = Mio_GateReadOutName(pGate);
    if (2 < (int)uVar1) {
      sVar9 = strlen(pcVar8);
      uVar2 = vTokens->nSize;
      uVar12 = 2;
      if (2 < (int)uVar2) {
        uVar12 = (ulong)uVar2;
      }
      uVar14 = 2;
      do {
        if (uVar12 == uVar14) goto LAB_0032b892;
        ppvVar10 = vTokens->pArray;
        pcVar11 = (char *)ppvVar10[uVar14];
        iVar4 = strncmp(pcVar8,pcVar11,(long)(int)sVar9);
        if ((iVar4 == 0) && (pcVar11[(int)sVar9] == '=')) {
          uVar3 = vTokens->nCap;
          if (uVar2 == uVar3) {
            if ((int)uVar3 < 0x10) {
              if (ppvVar10 == (void **)0x0) {
                ppvVar10 = (void **)malloc(0x80);
              }
              else {
                ppvVar10 = (void **)realloc(ppvVar10,0x80);
              }
              iVar4 = 0x10;
            }
            else {
              iVar4 = uVar3 * 2;
              if (iVar4 <= (int)uVar3) goto LAB_0032b7f3;
              if (ppvVar10 == (void **)0x0) {
                ppvVar10 = (void **)malloc((ulong)uVar3 << 4);
              }
              else {
                ppvVar10 = (void **)realloc(ppvVar10,(ulong)uVar3 << 4);
              }
            }
            vTokens->pArray = ppvVar10;
            vTokens->nCap = iVar4;
          }
LAB_0032b7f3:
          iVar4 = vTokens->nSize;
          vTokens->nSize = iVar4 + 1;
          vTokens->pArray[iVar4] = pcVar11;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uVar16 != uVar14);
    }
    iVar4 = vTokens->nSize;
    if (iVar4 - uVar1 != uVar1 - 2) {
      return 0;
    }
    if ((int)uVar1 < iVar4) {
      lVar13 = 2;
      do {
        if ((int)uVar1 < 0) goto LAB_0032b892;
        if (iVar4 <= lVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        vTokens->pArray[lVar13] = vTokens->pArray[lVar13 + (uVar16 - 2)];
        lVar13 = lVar13 + 1;
      } while ((int)(uVar1 + (int)lVar13 + -2) < iVar4);
    }
    if (iVar4 < (int)uVar1) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    vTokens->nSize = uVar1;
    return 1;
  }
  if (iVar4 != iVar6) {
    return 0;
  }
  iVar4 = Mio_GateReadPinNum(pGate);
  if (iVar15 == iVar4) {
    pcVar8 = Mio_GateReadOutName(pGate);
    sVar9 = strlen(pcVar8);
    if ((0 < (int)uVar1) && ((int)uVar1 <= vTokens->nSize)) {
      pcVar11 = (char *)vTokens->pArray[uVar1 - 1];
      iVar4 = strncmp(pcVar8,pcVar11,(long)(int)sVar9);
      if ((iVar4 == 0) && (pcVar11[(int)sVar9] == '=')) {
        Entry = (void *)0x0;
      }
      else {
        pcVar8 = Mio_GateReadOutName(pTwin);
        if (vTokens->nSize < (int)uVar1) goto LAB_0032b892;
        sVar9 = strlen(pcVar8);
        pcVar11 = (char *)vTokens->pArray[uVar1 - 1];
        iVar4 = strncmp(pcVar8,pcVar11,(long)(int)sVar9);
        if (iVar4 != 0) {
          return 0;
        }
        if (pcVar11[(int)sVar9] != '=') {
          return 0;
        }
        Entry = Vec_PtrPop(vTokens);
        Vec_PtrPush(vTokens,(void *)0x0);
      }
      Vec_PtrPush(vTokens,Entry);
      return 1;
    }
  }
  else {
    iVar4 = Mio_GateReadPinNum(pGate);
    if (uVar1 - 4 != iVar4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                    ,0x295,
                    "int Io_ReadBlifReorderFormalNames(Vec_Ptr_t *, Mio_Gate_t *, Mio_Gate_t *)");
    }
    pcVar8 = Mio_GateReadOutName(pGate);
    sVar9 = strlen(pcVar8);
    if ((1 < (int)uVar1) && ((int)(uVar1 - 2) < vTokens->nSize)) {
      pcVar11 = (char *)vTokens->pArray[uVar1 - 2];
      iVar4 = strncmp(pcVar8,pcVar11,(long)(int)sVar9);
      if (iVar4 != 0) {
        return 0;
      }
      if (pcVar11[(int)sVar9] == '=') {
        pcVar8 = Mio_GateReadOutName(pTwin);
        sVar9 = strlen(pcVar8);
        pcVar11 = (char *)Vec_PtrEntry(vTokens,uVar1 - 1);
        iVar4 = strncmp(pcVar8,pcVar11,(long)(int)sVar9);
        if (iVar4 == 0) {
          return (uint)(pcVar11[(int)sVar9] == '=');
        }
        return 0;
      }
      return 0;
    }
  }
LAB_0032b892:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Io_ReadBlifReorderFormalNames( Vec_Ptr_t * vTokens, Mio_Gate_t * pGate, Mio_Gate_t * pTwin )
{
    Mio_Pin_t * pGatePin;
    char * pName, * pNamePin;
    int i, k, nSize, Length;
    nSize = Vec_PtrSize(vTokens);
    if ( pTwin == NULL )
    {
        if ( nSize - 3 != Mio_GateReadPinNum(pGate) )
            return 0;
    }
    else
    {
        if ( nSize - 3 != Mio_GateReadPinNum(pGate) && nSize - 4 != Mio_GateReadPinNum(pGate) )
            return 0;
    }
    // check if the names are in order
    for ( pGatePin = Mio_GateReadPins(pGate), i = 0; pGatePin; pGatePin = Mio_PinReadNext(pGatePin), i++ )
    {
        pNamePin = Mio_PinReadName(pGatePin);
        Length = strlen(pNamePin);
        pName = (char *)Vec_PtrEntry(vTokens, i+2);
        if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
            continue;
        break;
    }
    if ( pTwin == NULL )
    {
        if ( i == Mio_GateReadPinNum(pGate) )
            return 1;
        // reorder the pins
        for ( pGatePin = Mio_GateReadPins(pGate), i = 0; pGatePin; pGatePin = Mio_PinReadNext(pGatePin), i++ )
        {
            pNamePin = Mio_PinReadName(pGatePin);
            Length = strlen(pNamePin);
            for ( k = 2; k < nSize; k++ )
            {
                pName = (char *)Vec_PtrEntry(vTokens, k);
                if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
                {
                    Vec_PtrPush( vTokens, pName );
                    break;
                }
            }
        }
        pNamePin = Mio_GateReadOutName(pGate);
        Length = strlen(pNamePin);
        for ( k = 2; k < nSize; k++ )
        {
            pName = (char *)Vec_PtrEntry(vTokens, k);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
            {
                Vec_PtrPush( vTokens, pName );
                break;
            }
        }
        if ( Vec_PtrSize(vTokens) - nSize != nSize - 2 )
            return 0;
        Vec_PtrForEachEntryStart( char *, vTokens, pName, k, nSize )
            Vec_PtrWriteEntry( vTokens, k - nSize + 2, pName );
        Vec_PtrShrink( vTokens, nSize );
    }
    else
    {
        if ( i != Mio_GateReadPinNum(pGate) ) // expect the correct order of input pins in the network with twin gates
            return 0;
        // check the last two entries
        if ( nSize - 3 == Mio_GateReadPinNum(pGate) ) // only one output is available
        {
            pNamePin = Mio_GateReadOutName(pGate);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' ) // the last entry is pGate
            {
                Vec_PtrPush( vTokens, NULL );
                return 1;
            }
            pNamePin = Mio_GateReadOutName(pTwin);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' ) // the last entry is pTwin
            {
                pName = (char *)Vec_PtrPop( vTokens );
                Vec_PtrPush( vTokens, NULL );
                Vec_PtrPush( vTokens, pName );
                return 1;
            }
            return 0;
        }
        if ( nSize - 4 == Mio_GateReadPinNum(pGate) ) // two outputs are available
        {
            pNamePin = Mio_GateReadOutName(pGate);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 2);
            if ( !(!strncmp( pNamePin, pName, Length ) && pName[Length] == '=') )
                return 0;
            pNamePin = Mio_GateReadOutName(pTwin);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !(!strncmp( pNamePin, pName, Length ) && pName[Length] == '=') )
                return 0;
            return 1;
        }
        assert( 0 );
    }
    return 1;
}